

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

string * jbcoin::Logs::scrub(string *__return_storage_ptr__,string *s)

{
  size_t sVar1;
  long lVar2;
  unsigned_long *puVar3;
  undefined1 *puVar4;
  ulong local_48;
  size_t i;
  unsigned_long local_38;
  ulong local_30;
  size_t endingPosition;
  size_t startingPosition;
  char *secretToken;
  string *s_local;
  
  startingPosition = (size_t)anon_var_dwarf_12ecf1;
  secretToken = (char *)s;
  s_local = __return_storage_ptr__;
  endingPosition = std::__cxx11::string::find((char *)s,0x469c4a);
  if (endingPosition != 0xffffffffffffffff) {
    sVar1 = strlen((char *)startingPosition);
    endingPosition = sVar1 + endingPosition;
    local_38 = endingPosition + 0x23;
    lVar2 = std::__cxx11::string::size();
    i = lVar2 - 1;
    puVar3 = std::min<unsigned_long>(&local_38,&i);
    local_30 = *puVar3;
    for (local_48 = endingPosition; local_48 < local_30; local_48 = local_48 + 1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
      *puVar4 = 0x2a;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string
Logs::scrub (std::string s)
{
    using namespace std;
    char const* secretToken = "\"secret\"";
    // Look for the first occurrence of "secret" in the string.
    size_t startingPosition = s.find (secretToken);
    if (startingPosition != string::npos)
    {
        // Found it, advance past the token.
        startingPosition += strlen (secretToken);
        // Replace the next 35 characters at most, without overwriting the end.
        size_t endingPosition = std::min (startingPosition + 35, s.size () - 1);
        for (size_t i = startingPosition; i < endingPosition; ++i)
            s [i] = '*';
    }
    return s;
}